

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O2

void __thiscall chrono::fea::ChMesh::VariablesFbLoadForces(ChMesh *this,double factor)

{
  pointer psVar1;
  element_type *peVar2;
  long lVar3;
  pointer psVar4;
  uint uVar5;
  
  uVar5 = 0;
  while( true ) {
    psVar1 = (this->vnodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->vnodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)uVar5) break;
    peVar2 = psVar1[uVar5].
             super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar3 = *(long *)((long)peVar2->_vptr_ChNodeFEAbase + -0x18);
    (**(code **)(*(long *)((long)&peVar2->_vptr_ChNodeFEAbase + lVar3) + 0x80))
              (factor,(long)&peVar2->_vptr_ChNodeFEAbase + lVar3);
    uVar5 = uVar5 + 1;
  }
  uVar5 = 0;
  while( true ) {
    psVar4 = (this->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->velements).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4) <=
        (ulong)uVar5) break;
    (*(psVar4[uVar5].super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_ChElementBase[0x13])(factor);
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void ChMesh::VariablesFbLoadForces(double factor) {
    // applied nodal forces
    for (unsigned int in = 0; in < vnodes.size(); in++)
        vnodes[in]->VariablesFbLoadForces(factor);

    // internal forces
    for (unsigned int ie = 0; ie < velements.size(); ie++)
        velements[ie]->VariablesFbLoadInternalForces(factor);
}